

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O1

char * ValidateLabel(char *naam,bool setNameSpace,bool ignoreCharAfter)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char **ppcVar5;
  size_t sVar6;
  char *__dest;
  size_t sVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  if (naam == (char *)0x0) {
    Error("Invalid labelname",(char *)0x0,PASS3);
    return (char *)0x0;
  }
  bVar10 = *naam == '!';
  pcVar4 = naam + bVar10;
  bVar11 = false;
  if ((!bVar10 && setNameSpace) && (macrolabp != (char *)0x0)) {
    if (*pcVar4 == '@') {
      bVar11 = pcVar4[1] == '.';
    }
    else {
      bVar11 = false;
    }
  }
  cVar1 = pcVar4[bVar11];
  bVar2 = isLabelStart(pcVar4 + bVar11,true);
  pcVar4 = pcVar4 + bVar11 + (cVar1 == '@' || cVar1 == '.');
  if (bVar2) {
    bVar12 = cVar1 == '.';
    bVar11 = bVar11 == false;
    bVar13 = macrolabp != (char *)0x0;
    bVar2 = false;
    if ((((!bVar11 || !bVar12) || !bVar13) && (cVar1 != '.')) && (cVar1 != '@')) {
      bVar2 = ModuleName[0] != '\0';
    }
    lVar8 = 0;
    do {
      lVar9 = lVar8;
      iVar3 = islabchar(pcVar4[lVar9]);
      lVar8 = lVar9 + 1;
    } while (iVar3 != 0);
    if (pcVar4[lVar9] != '\0') {
      if (pcVar4[lVar9] == '[') goto LAB_0012fd0f;
      if (!ignoreCharAfter) goto LAB_0012fcfb;
    }
    iVar3 = (int)lVar9;
    if (0x40 < iVar3) {
      Error("Label too long",pcVar4,IF_FIRST);
    }
    if (cVar1 == '.' || (bVar11 && bVar12) && bVar13) {
      if ((bVar11 && bVar12) && bVar13) {
        ppcVar5 = &macrolabp;
      }
      else {
        ppcVar5 = &vorlabp;
      }
      sVar6 = strlen(*ppcVar5);
      iVar3 = (int)(lVar9 + 1) + (int)sVar6;
    }
    if (bVar2) {
      sVar6 = strlen(ModuleName);
      iVar3 = iVar3 + (int)sVar6 + 1;
    }
    __dest = (char *)operator_new__((long)(iVar3 + 1));
    *__dest = '\0';
    sVar6 = (size_t)iVar3;
    if (bVar2) {
      strncat(__dest,ModuleName,sVar6);
      sVar7 = strlen(__dest);
      (__dest + sVar7)[0] = '.';
      (__dest + sVar7)[1] = '\0';
    }
    if (cVar1 == '.' || (bVar11 && bVar12) && bVar13) {
      if ((bVar11 && bVar12) && bVar13) {
        ppcVar5 = &macrolabp;
      }
      else {
        ppcVar5 = &vorlabp;
      }
      strncat(__dest,*ppcVar5,sVar6);
      sVar7 = strlen(__dest);
      *(ushort *)(__dest + sVar7) = (ushort)((bVar11 && bVar12) && bVar13) << 4 | 0x2e;
    }
    sVar7 = strlen(__dest);
    lVar8 = 0;
    do {
      iVar3 = islabchar(pcVar4[lVar8]);
      if (iVar3 == 0) break;
      __dest[lVar8 + sVar7] = pcVar4[lVar8];
      lVar8 = lVar8 + 1;
    } while ((int)lVar8 != 0x40);
    __dest[lVar8 + sVar7] = '\0';
    if ((long)sVar6 < (long)(__dest + lVar8 + sVar7) - (long)__dest) {
      Error("internal error",(char *)0x0,FATAL);
    }
    if ((!bVar10 && setNameSpace) && (cVar1 != '.')) {
      free(vorlabp);
      vorlabp = strdup(__dest);
      if (vorlabp == (char *)0x0) {
        ErrorOOM();
      }
    }
  }
  else {
LAB_0012fcfb:
    Error("Invalid labelname",pcVar4,PASS3);
LAB_0012fd0f:
    __dest = (char *)0x0;
  }
  return __dest;
}

Assistant:

char* ValidateLabel(const char* naam, bool setNameSpace, bool ignoreCharAfter) {
	if (nullptr == naam) {
		Error("Invalid labelname");
		return nullptr;
	}
	if ('!' == *naam) {
		setNameSpace = false;
		++naam;
	}
	// check if local label defined inside macro wants to become non-macro local label
	const bool escMacro = setNameSpace && macrolabp && ('@' == naam[0]) && ('.' == naam[1]);
	if (escMacro) ++naam;			// such extra "@" is consumed right here and only '.' is left
	// regular single prefix case in other use cases
	const bool global = '@' == *naam;
	const bool local = '.' == *naam;
	if (!isLabelStart(naam)) {		// isLabelStart assures that only single modifier exist
		if (global || local) ++naam;// single modifier is parsed (even when invalid name)
		Error("Invalid labelname", naam);
		return nullptr;
	}
	if (global || local) ++naam;	// single modifier is parsed
	const bool inMacro = !escMacro && local && macrolabp;
	const bool inModule = !inMacro && !global && !local && ModuleName[0];
	// check all chars of label
	const char* np = naam;
	while (islabchar(*np)) ++np;
	if ('[' == *np) return nullptr;	// this is DEFARRAY name, do not process it as label (silent exit)
	if (*np && !ignoreCharAfter) {
		// if this is supposed to be new label, there shoulnd't be anything else after it
		Error("Invalid labelname", naam);
		return nullptr;
	}
	// calculate expected length of fully qualified label name
	int labelLen = (np - naam), truncateAt = LABMAX;
	if (LABMAX < labelLen) Error("Label too long", naam, IF_FIRST);	// non-fatal error, will truncate it
	if (inMacro) labelLen += 1 + strlen(macrolabp);
	else if (local) labelLen += 1 + strlen(vorlabp);
	if (inModule) labelLen += 1 + strlen(ModuleName);
	// build fully qualified label name (in newly allocated memory buffer, with precise length)
	char* const label = new char[1+labelLen];
	if (nullptr == label) ErrorOOM();
	label[0] = 0;
	if (inModule) {
		STRCAT(label, labelLen, ModuleName);	STRCAT(label, 2, ".");
	}
	if (inMacro) {
		STRCAT(label, labelLen, macrolabp);		STRCAT(label, 2, ">");
	} else if (local) {
		STRCAT(label, labelLen, vorlabp);		STRCAT(label, 2, ".");
	}
	char* lp = label + strlen(label);
	while (truncateAt-- && islabchar(*naam)) *lp++ = *naam++;	// add the new label (truncated if needed)
	*lp = 0;
	if (labelLen < lp - label) Error("internal error", nullptr, FATAL);		// should never happen :)
	if (setNameSpace && !local) {
		free(vorlabp);
		vorlabp = STRDUP(label);
		if (vorlabp == NULL) ErrorOOM();
	}
	return label;
}